

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O2

StringList * Rml::GetTextureSourceList_abi_cxx11_(void)

{
  pointer ppVar1;
  CoreData *pCVar2;
  StringList *in_RDI;
  pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>
  *render_manager;
  pointer ppVar3;
  
  (in_RDI->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (core_data._8_8_ != 0) {
    pCVar2 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    ppVar1 = (pCVar2->render_managers).m_container.
             super__Vector_base<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>,_std::allocator<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar3 = (pCVar2->render_managers).m_container.
                  super__Vector_base<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>,_std::allocator<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1)
    {
      RenderManagerAccess::GetTextureSourceList
                ((ppVar3->second)._M_t.
                 super___uniq_ptr_impl<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Rml::RenderManager_*,_std::default_delete<Rml::RenderManager>_>
                 .super__Head_base<0UL,_Rml::RenderManager_*,_false>._M_head_impl,in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

StringList GetTextureSourceList()
{
	StringList result;
	if (!core_data)
		return result;
	for (const auto& render_manager : core_data->render_managers)
	{
		RenderManagerAccess::GetTextureSourceList(render_manager.second.get(), result);
	}
	return result;
}